

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O2

void __thiscall
spvtools::opt::VectorDCE::MarkUsesAsLive
          (VectorDCE *this,Instruction *current_inst,BitVector *live_elements,
          LiveComponentMap *live_components,
          vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
          *work_list)

{
  DefUseManager *pDVar1;
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  *work_list_local;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  work_list_local = work_list;
  pDVar1 = IRContext::get_def_use_mgr((this->super_MemPass).super_Pass.context_);
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = ::operator_new(0x28);
  *(vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
    ***)local_50._M_unused._0_8_ = &work_list_local;
  *(BitVector **)((long)local_50._M_unused._0_8_ + 8) = live_elements;
  *(VectorDCE **)((long)local_50._M_unused._0_8_ + 0x10) = this;
  *(LiveComponentMap **)((long)local_50._M_unused._0_8_ + 0x18) = live_components;
  *(DefUseManager **)((long)local_50._M_unused._0_8_ + 0x20) = pDVar1;
  local_38 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp:246:29)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp:246:29)>
             ::_M_manager;
  Instruction::ForEachInId(current_inst,(function<void_(unsigned_int_*)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return;
}

Assistant:

void VectorDCE::MarkUsesAsLive(
    Instruction* current_inst, const utils::BitVector& live_elements,
    LiveComponentMap* live_components,
    std::vector<VectorDCE::WorkListItem>* work_list) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  current_inst->ForEachInId([&work_list, &live_elements, this, live_components,
                             def_use_mgr](uint32_t* operand_id) {
    Instruction* operand_inst = def_use_mgr->GetDef(*operand_id);

    if (HasVectorResult(operand_inst)) {
      WorkListItem new_item;
      new_item.instruction = operand_inst;
      new_item.components = live_elements;
      AddItemToWorkListIfNeeded(new_item, live_components, work_list);
    } else if (HasScalarResult(operand_inst)) {
      WorkListItem new_item;
      new_item.instruction = operand_inst;
      new_item.components.Set(0);
      AddItemToWorkListIfNeeded(new_item, live_components, work_list);
    }
  });
}